

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# wire_format_lite.cc
# Opt level: O3

bool google::protobuf::internal::WireFormatLite::ReadString(CodedInputStream *input,string *value)

{
  uint8 uVar1;
  uint uVar2;
  bool bVar3;
  uint8 *puVar4;
  uint8 *puVar5;
  pointer __dest;
  ulong __n;
  uint32 length;
  uint local_2c;
  
  puVar4 = input->buffer_;
  puVar5 = input->buffer_end_;
  if ((puVar4 < puVar5) && (uVar1 = *puVar4, -1 < (char)uVar1)) {
    puVar4 = puVar4 + 1;
    input->buffer_ = puVar4;
    local_2c = (int)(char)uVar1;
  }
  else {
    bVar3 = io::CodedInputStream::ReadVarint32Fallback(input,&local_2c);
    if ((int)local_2c < 0 || !bVar3) {
      return false;
    }
    puVar4 = input->buffer_;
    puVar5 = input->buffer_end_;
  }
  uVar2 = local_2c;
  if ((int)puVar5 - (int)puVar4 < (int)local_2c) {
    bVar3 = io::CodedInputStream::ReadStringFallback(input,value,local_2c);
  }
  else {
    __n = (ulong)local_2c;
    std::__cxx11::string::resize((ulong)value,(char)local_2c);
    bVar3 = true;
    if (uVar2 != 0) {
      if (value->_M_string_length == 0) {
        __dest = (pointer)0x0;
      }
      else {
        __dest = (value->_M_dataplus)._M_p;
      }
      memcpy(__dest,input->buffer_,__n);
      input->buffer_ = input->buffer_ + __n;
    }
  }
  return bVar3;
}

Assistant:

bool WireFormatLite::ReadString(io::CodedInputStream* input,
                                string* value) {
  // String is for UTF-8 text only
  uint32 length;
  if (!input->ReadVarint32(&length)) return false;
  if (!input->InternalReadStringInline(value, length)) return false;
  return true;
}